

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Status json_object_set_value(JSON_Object *object,char *name,JSON_Value *value)

{
  size_t sVar1;
  uint in_EAX;
  JSON_Status JVar2;
  size_t sVar3;
  unsigned_long hash;
  size_t sVar4;
  char *pcVar5;
  undefined8 uStack_38;
  
  JVar2 = -1;
  if ((value != (JSON_Value *)0x0 && (name != (char *)0x0 && object != (JSON_Object *)0x0)) &&
     (value->parent == (JSON_Value *)0x0)) {
    uStack_38._0_4_ = in_EAX;
    sVar3 = strlen(name);
    hash = hash_string(name,sVar3);
    uStack_38 = (ulong)(uint)uStack_38;
    sVar4 = json_object_get_cell_ix(object,name,sVar3,hash,(parson_bool_t *)((long)&uStack_38 + 4));
    if (uStack_38._4_4_ == 0) {
      if (object->item_capacity <= object->count) {
        JVar2 = json_object_grow_and_rehash(object);
        if (JVar2 != 0) {
          return -1;
        }
        sVar3 = strlen(name);
        sVar4 = json_object_get_cell_ix
                          (object,name,sVar3,hash,(parson_bool_t *)((long)&uStack_38 + 4));
      }
      pcVar5 = parson_strdup(name);
      if (pcVar5 == (char *)0x0) {
        return -1;
      }
      sVar1 = object->count;
      object->names[sVar1] = pcVar5;
      object->cells[sVar4] = sVar1;
      object->values[sVar1] = value;
      object->cell_ixs[sVar1] = sVar4;
      object->hashes[object->count] = hash;
      object->count = object->count + 1;
    }
    else {
      sVar4 = object->cells[sVar4];
      json_value_free(object->values[sVar4]);
      object->values[sVar4] = value;
    }
    value->parent = object->wrapping_value;
    JVar2 = 0;
  }
  return JVar2;
}

Assistant:

JSON_Status json_object_set_value(JSON_Object *object, const char *name, JSON_Value *value) {
    unsigned long hash = 0;
    parson_bool_t found = PARSON_FALSE;
    size_t cell_ix = 0;
    size_t item_ix = 0;
    JSON_Value *old_value = NULL;
    char *key_copy = NULL;

    if (!object || !name || !value || value->parent) {
        return JSONFailure;
    }
    hash = hash_string(name, strlen(name));
    found = PARSON_FALSE;
    cell_ix = json_object_get_cell_ix(object, name, strlen(name), hash, &found);
    if (found) {
        item_ix = object->cells[cell_ix];
        old_value = object->values[item_ix];
        json_value_free(old_value);
        object->values[item_ix] = value;
        value->parent = json_object_get_wrapping_value(object);
        return JSONSuccess;
    }
    if (object->count >= object->item_capacity) {
        JSON_Status res = json_object_grow_and_rehash(object);
        if (res != JSONSuccess) {
            return JSONFailure;
        }
        cell_ix = json_object_get_cell_ix(object, name, strlen(name), hash, &found);
    }
    key_copy = parson_strdup(name);
    if (!key_copy) {
        return JSONFailure;
    }
    object->names[object->count] = key_copy;
    object->cells[cell_ix] = object->count;
    object->values[object->count] = value;
    object->cell_ixs[object->count] = cell_ix;
    object->hashes[object->count] = hash;
    object->count++;
    value->parent = json_object_get_wrapping_value(object);
    return JSONSuccess;
}